

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader14.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader14::begin__input____InputLocalOffset
          (LibraryControllersLoader14 *this,input____InputLocalOffset__AttributeData *attributeData)

{
  byte bVar1;
  uint *in_RSI;
  long in_RDI;
  bool bVar2;
  input____InputLocalOffset__AttributeData attrData;
  uint local_38 [2];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_28 = *(undefined8 *)(in_RSI + 4);
  local_20 = *(undefined8 *)(in_RSI + 6);
  bVar2 = (*in_RSI & 1) == 1;
  if (bVar2) {
    local_30 = *(undefined8 *)(in_RSI + 2);
  }
  local_38[0] = (uint)bVar2;
  if ((*in_RSI & 2) == 2) {
    local_18 = *(undefined8 *)(in_RSI + 8);
    local_38[0] = local_38[0] | 2;
  }
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x118))(*(long **)(in_RDI + 0x20),local_38);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryControllersLoader14::begin__input____InputLocalOffset( const COLLADASaxFWL14::input____InputLocalOffset__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__input____InputLocalOffset(attributeData));
COLLADASaxFWL::input____InputLocalOffset__AttributeData attrData;
attrData.present_attributes = 0;
attrData.semantic = attributeData.semantic;
attrData.source = attributeData.source;
if ( (attributeData.present_attributes & COLLADASaxFWL14::input____InputLocalOffset__AttributeData::ATTRIBUTE_OFFSET_PRESENT) == COLLADASaxFWL14::input____InputLocalOffset__AttributeData::ATTRIBUTE_OFFSET_PRESENT ) {
    attrData.offset = attributeData.offset;
    attrData.present_attributes |= COLLADASaxFWL::input____InputLocalOffset__AttributeData::ATTRIBUTE_OFFSET_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL14::input____InputLocalOffset__AttributeData::ATTRIBUTE_SET_PRESENT) == COLLADASaxFWL14::input____InputLocalOffset__AttributeData::ATTRIBUTE_SET_PRESENT ) {
    attrData.set = attributeData.set;
    attrData.present_attributes |= COLLADASaxFWL::input____InputLocalOffset__AttributeData::ATTRIBUTE_SET_PRESENT;
}
return mLoader->begin__input____InputLocalOffset(attrData);
}